

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O1

size_t wwHiZeroBits(word *a,size_t n)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0x40;
  sVar1 = n;
  do {
    bVar3 = sVar1 == 0;
    sVar1 = sVar1 - 1;
    if (bVar3) {
      return n << 6;
    }
    lVar2 = lVar2 + -0x40;
  } while (a[sVar1] == 0);
  sVar1 = u64CLZ(a[sVar1]);
  return sVar1 - lVar2;
}

Assistant:

size_t wwHiZeroBits(const word a[], size_t n)
{
	register size_t i = n;
	ASSERT(wwIsValid(a, n));
	// поиск старшего ненулевого машинного слова
	while (i-- && a[i] == 0);
	// нулевое слово?
	if (i == SIZE_MAX)
		return n * B_PER_W;
	// ... ненулевое
	return (n - i - 1) * B_PER_W + wordCLZ(a[i]);
}